

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O1

void __thiscall restincurl::Result::Result(Result *this,CURLcode *code)

{
  char *pcVar1;
  char *__s;
  
  this->curl_code = CURLE_OK;
  this->http_response_code = 0;
  (this->msg)._M_dataplus._M_p = (pointer)&(this->msg).field_2;
  (this->msg)._M_string_length = 0;
  (this->msg).field_2._M_local_buf[0] = '\0';
  (this->body)._M_dataplus._M_p = (pointer)&(this->body).field_2;
  (this->body)._M_string_length = 0;
  (this->body).field_2._M_local_buf[0] = '\0';
  this->curl_code = *code;
  __s = (char *)curl_easy_strerror(*code);
  pcVar1 = (char *)(this->msg)._M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&this->msg,0,pcVar1,(ulong)__s);
  return;
}

Assistant:

Result(const CURLcode& code) {
            curl_code = code;
            msg = curl_easy_strerror(code);
        }